

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::showDetailsView(QFileDialogPrivate *this)

{
  Ui_QFileDialog *pUVar1;
  
  QAbstractButton::setDown(&((this->qFileDialogUi).d)->listModeButton->super_QAbstractButton,false);
  QAbstractButton::setDown(&((this->qFileDialogUi).d)->detailModeButton->super_QAbstractButton,true)
  ;
  QWidget::hide((QWidget *)((this->qFileDialogUi).d)->listView);
  QWidget::show((QWidget *)((this->qFileDialogUi).d)->treeView);
  pUVar1 = (this->qFileDialogUi).d;
  QStackedWidget::setCurrentWidget
            (pUVar1->stackedWidget,
             *(QWidget **)
              (*(long *)&(pUVar1->treeView->super_QTreeView).super_QAbstractItemView.
                         super_QAbstractScrollArea.super_QFrame.super_QWidget.field_0x8 + 0x10));
  (**(code **)(*(long *)&(((this->qFileDialogUi).d)->treeView->super_QTreeView).
                         super_QAbstractItemView.super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x220))();
  return;
}

Assistant:

void QFileDialogPrivate::showDetailsView()
{
    qFileDialogUi->listModeButton->setDown(false);
    qFileDialogUi->detailModeButton->setDown(true);
    qFileDialogUi->listView->hide();
    qFileDialogUi->treeView->show();
    qFileDialogUi->stackedWidget->setCurrentWidget(qFileDialogUi->treeView->parentWidget());
    qFileDialogUi->treeView->doItemsLayout();
}